

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mfsri(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  uint uVar1;
  uint uVar2;
  uintptr_t o;
  
  if (ctx->pr == true) {
    gen_priv_exception(ctx,1);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  uVar1 = ctx->opcode >> 0x15 & 0x1f;
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_reg_index(ctx,EA);
  tcg_gen_extract_i64_ppc64(tcg_ctx,EA,EA,0x1c,4);
  gen_helper_load_sr(tcg_ctx,cpu_gpr[uVar1],tcg_ctx->cpu_env,EA);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  if (uVar2 == uVar1 || uVar2 == 0) {
    return;
  }
  tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_gpr[uVar2],cpu_gpr[uVar1]);
  return;
}

Assistant:

static void gen_mfsri(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    tcg_gen_extract_tl(tcg_ctx, t0, t0, 28, 4);
    gen_helper_load_sr(tcg_ctx, cpu_gpr[rd], tcg_ctx->cpu_env, t0);
    tcg_temp_free(tcg_ctx, t0);
    if (ra != 0 && ra != rd) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rd]);
    }
}